

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::SwapExtension
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other,int number)

{
  Extension *other_extension;
  Extension *other_extension_00;
  Extension *other_extension_01;
  ExtensionSet *const_this_1;
  ExtensionSet *const_this;
  ExtensionSet temp;
  ExtensionSet local_48;
  
  if (this != other) {
    if (this->arena_ == other->arena_) {
      UnsafeShallowSwapExtension(this,other,number);
      return;
    }
    other_extension = FindOrNull(this,number);
    other_extension_00 = FindOrNull(other,number);
    if (other_extension != other_extension_00) {
      if (other_extension_00 == (Extension *)0x0 || other_extension == (Extension *)0x0) {
        if (other_extension == (Extension *)0x0) {
          InternalExtensionMergeFrom(this,extendee,number,other_extension_00,other->arena_);
          if (other->arena_ == (Arena *)0x0) {
            Extension::Free(other_extension_00);
          }
        }
        else {
          InternalExtensionMergeFrom(other,extendee,number,other_extension,this->arena_);
          other = this;
          if (this->arena_ == (Arena *)0x0) {
            Extension::Free(other_extension);
          }
        }
        Erase(other,number);
        return;
      }
      local_48.arena_ = (Arena *)0x0;
      local_48.flat_capacity_ = 0;
      local_48.flat_size_ = 0;
      local_48.map_.flat = (KeyValue *)0x0;
      InternalExtensionMergeFrom(&local_48,extendee,number,other_extension_00,other->arena_);
      other_extension_01 = FindOrNull(&local_48,number);
      Extension::Clear(other_extension_00);
      InternalExtensionMergeFrom(other,extendee,number,other_extension,this->arena_);
      Extension::Clear(other_extension);
      InternalExtensionMergeFrom(this,extendee,number,other_extension_01,local_48.arena_);
      ~ExtensionSet(&local_48);
    }
  }
  return;
}

Assistant:

void ExtensionSet::SwapExtension(const MessageLite* extendee,
                                 ExtensionSet* other, int number) {
  if (this == other) return;

  if (GetArena() == other->GetArena()) {
    UnsafeShallowSwapExtension(other, number);
    return;
  }

  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == other_ext) return;

  if (this_ext != nullptr && other_ext != nullptr) {
    // TODO(cfallin, rohananil): We could further optimize these cases,
    // especially avoid creation of ExtensionSet, and move MergeFrom logic
    // into Extensions itself (which takes arena as an argument).
    // We do it this way to reuse the copy-across-arenas logic already
    // implemented in ExtensionSet's MergeFrom.
    ExtensionSet temp;
    temp.InternalExtensionMergeFrom(extendee, number, *other_ext,
                                    other->GetArena());
    Extension* temp_ext = temp.FindOrNull(number);

    other_ext->Clear();
    other->InternalExtensionMergeFrom(extendee, number, *this_ext,
                                      this->GetArena());
    this_ext->Clear();
    InternalExtensionMergeFrom(extendee, number, *temp_ext, temp.GetArena());
  } else if (this_ext == nullptr) {
    InternalExtensionMergeFrom(extendee, number, *other_ext, other->GetArena());
    if (other->GetArena() == nullptr) other_ext->Free();
    other->Erase(number);
  } else {
    other->InternalExtensionMergeFrom(extendee, number, *this_ext,
                                      this->GetArena());
    if (GetArena() == nullptr) this_ext->Free();
    Erase(number);
  }
}